

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormTests.cpp
# Opt level: O2

void __thiscall
MockFormTestFixture_testUserCreateForm_Test::MockFormTestFixture_testUserCreateForm_Test
          (MockFormTestFixture_testUserCreateForm_Test *this)

{
  MockFormTestFixture::MockFormTestFixture(&this->super_MockFormTestFixture);
  (this->super_MockFormTestFixture).super_Test._vptr_Test = (_func_int **)&PTR__Test_00138170;
  return;
}

Assistant:

TEST_F(MockFormTestFixture, testUserCreateForm) {
    MockUserCreateForm object("Saksham", "Banga", "admin2@admin.com", "password", true);
    if(object.isValid())
    {
        object.save();
        ASSERT_EQ(BaseUser::findByEmail("admin2@admin.com")->getFullName(),"Saksham Banga");
    }
    else
        ASSERT_EQ(1,0);//means test has certainly failed
}